

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveIn * __thiscall
chrono::ChArchiveIn::operator>>(ChArchiveIn *this,ChNameValue<chrono::ChCoordsys<double>_> *bVal)

{
  ChNameValue<chrono::ChCoordsys<double>_> local_30;
  ChNameValue<chrono::ChCoordsys<double>_> *local_18;
  ChNameValue<chrono::ChCoordsys<double>_> *bVal_local;
  ChArchiveIn *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<chrono::ChCoordsys<double>_> *)this;
  ChNameValue<chrono::ChCoordsys<double>_>::ChNameValue(&local_30,bVal);
  in<chrono::ChCoordsys<double>>(this,&local_30);
  ChNameValue<chrono::ChCoordsys<double>_>::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveIn& operator>>(ChNameValue<T> bVal) {
          this->in(bVal);
          return (*this);
      }